

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutTable.cpp
# Opt level: O1

void __thiscall ShortcutTable::set(ShortcutTable *this,Shortcut shortcut,QKeySequence *seq)

{
  QKeySequence *this_00;
  
  this_00 = (QKeySequence *)((this->mTable)._M_elems + shortcut);
  if ((this->mTable)._M_elems[shortcut].super__Optional_base<QKeySequence,_false,_false>._M_payload.
      super__Optional_payload<QKeySequence,_true,_false,_false>.
      super__Optional_payload_base<QKeySequence>._M_engaged == true) {
    QKeySequence::operator=(this_00,seq);
  }
  else {
    std::optional<QKeySequence>::operator=((optional<QKeySequence> *)this_00,seq);
  }
  return;
}

Assistant:

void ShortcutTable::set(Shortcut shortcut, QKeySequence const& seq) noexcept {
    auto &ref = mTable[shortcut];
    if (ref) {
        *ref = seq;
    } else {
        ref = seq;
    }
}